

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowCustomAggregator::Evaluate
          (WindowCustomAggregator *this,WindowAggregatorState *gsink,WindowAggregatorState *lstate,
          DataChunk *bounds,Vector *result,idx_t count,idx_t row_idx)

{
  ArenaAllocator *this_00;
  WindowExcludeMode WVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  aggregate_window_t p_Var7;
  pointer pWVar8;
  const_reference pvVar9;
  reference pvVar10;
  ulong uVar11;
  type pWVar12;
  ulong uVar13;
  size_type __n;
  idx_t i;
  idx_t iVar14;
  ulong uVar15;
  const_data_ptr_t local_a0;
  AggregateInputData local_48;
  
  if (gsink[7].allocator.allocator == (Allocator *)0x0) {
    local_a0 = (const_data_ptr_t)0x0;
  }
  else {
    pWVar8 = unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>,_true>
             ::operator->((unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>,_true>
                           *)&gsink[7].allocator);
    local_a0 = (pWVar8->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  this_00 = &lstate[7].allocator;
  WVar1 = (this->super_WindowAggregator).exclude_mode;
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,6);
  pdVar2 = pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,7);
  pdVar3 = pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,2);
  pdVar4 = pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,3);
  pdVar5 = pvVar9->data;
  iVar14 = 0;
  do {
    if (count == iVar14) {
      return;
    }
    uVar13 = *(ulong *)(pdVar2 + iVar14 * 8);
    uVar6 = *(ulong *)(pdVar3 + iVar14 * 8);
    if (WVar1 == NO_OTHER) {
      __n = 0;
    }
    else {
      uVar11 = row_idx;
      if (WVar1 != CURRENT_ROW) {
        uVar11 = *(ulong *)(pdVar4 + iVar14 * 8);
      }
      if (uVar6 <= uVar11) {
        uVar11 = uVar6;
      }
      if (uVar11 <= uVar13) {
        uVar11 = uVar13;
      }
      pvVar10 = vector<duckdb::FrameBounds,_true>::get<true>
                          ((vector<duckdb::FrameBounds,_true> *)this_00,0);
      pvVar10->start = uVar13;
      pvVar10->end = uVar11;
      if (WVar1 == TIES) {
        uVar11 = uVar13;
        if (uVar13 < row_idx) {
          uVar11 = row_idx;
        }
        if (uVar6 <= uVar11) {
          uVar11 = uVar6;
        }
        uVar15 = row_idx + 1;
        if (uVar6 <= row_idx + 1) {
          uVar15 = uVar6;
        }
        if (uVar15 <= uVar13) {
          uVar15 = uVar13;
        }
        pvVar10 = vector<duckdb::FrameBounds,_true>::get<true>
                            ((vector<duckdb::FrameBounds,_true> *)this_00,1);
        pvVar10->start = uVar11;
        pvVar10->end = uVar15;
        __n = 2;
LAB_01aa3a86:
        uVar11 = *(ulong *)(pdVar5 + iVar14 * 8);
      }
      else {
        __n = 1;
        if (WVar1 != CURRENT_ROW) goto LAB_01aa3a86;
        uVar11 = row_idx + 1;
      }
      if (uVar13 < uVar11) {
        uVar13 = uVar11;
      }
      if (uVar6 <= uVar13) {
        uVar13 = uVar6;
      }
    }
    pvVar10 = vector<duckdb::FrameBounds,_true>::get<true>
                        ((vector<duckdb::FrameBounds,_true> *)this_00,__n);
    pvVar10->start = uVar13;
    pvVar10->end = uVar6;
    local_48.bind_data.ptr = AggregateObject::GetFunctionData(&(this->super_WindowAggregator).aggr);
    local_48.combine_type = PRESERVE_INPUT;
    p_Var7 = (this->super_WindowAggregator).aggr.function.window;
    local_48.allocator = &lstate->allocator;
    pWVar12 = unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>,_true>
              ::operator*((unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>,_true>
                           *)&gsink[7].allocator.initial_capacity);
    (*p_Var7)(&local_48,pWVar12,local_a0,
              (data_ptr_t)lstate[5].allocator.arena_allocator.allocate_function,(SubFrames *)this_00
              ,result,iVar14);
    iVar14 = iVar14 + 1;
    row_idx = row_idx + 1;
  } while( true );
}

Assistant:

void WindowCustomAggregator::Evaluate(const WindowAggregatorState &gsink, WindowAggregatorState &lstate,
                                      const DataChunk &bounds, Vector &result, idx_t count, idx_t row_idx) const {
	auto &lcstate = lstate.Cast<WindowCustomAggregatorState>();
	auto &frames = lcstate.frames;
	const_data_ptr_t gstate_p = nullptr;
	auto &gcsink = gsink.Cast<WindowCustomAggregatorGlobalState>();
	if (gcsink.gcstate) {
		gstate_p = gcsink.gcstate->state.data();
	}

	EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		// Extract the range
		AggregateInputData aggr_input_data(aggr.GetFunctionData(), lstate.allocator);
		aggr.function.window(aggr_input_data, *gcsink.partition_input, gstate_p, lcstate.state.data(), frames, result,
		                     i);
	});
}